

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  bool bVar1;
  reference pbVar2;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string fullName;
  string *fileName_local;
  char *includeName_local;
  char *dir_local;
  cmFortranParser_s *this_local;
  
  fullName.field_2._8_8_ = fileName;
  bVar1 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,includeName);
    this_local._7_1_ = cmsys::SystemTools::FileExists((string *)fullName.field_2._8_8_,true);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,dir,&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::string::operator+=((string *)local_50,"/");
    std::__cxx11::string::operator+=((string *)local_50,includeName);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_50,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,(string *)local_50);
      this_local._7_1_ = true;
    }
    else {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->IncludePath);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->IncludePath);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&i);
        if (!bVar1) break;
        pbVar2 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::string::operator=((string *)local_50,(string *)pbVar2);
        std::__cxx11::string::operator+=((string *)local_50,"/");
        std::__cxx11::string::operator+=((string *)local_50,includeName);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_50,true);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,(string *)local_50);
          this_local._7_1_ = true;
          goto LAB_0038f402;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = false;
    }
LAB_0038f402:
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = dir;
  fullName += "/";
  fullName += includeName;
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = i;
    fullName += "/";
    fullName += includeName;
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}